

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::DoubletonEquationPS
          (DoubletonEquationPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _j,int _k,int _i,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *oldLo,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  element_type *peVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Item *pIVar5;
  Real a;
  int32_t iVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  pointer pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  byte bVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar14 = 0;
  peVar2 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_240._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_240._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_240._M_pi)->_M_use_count = (local_240._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_240._M_pi)->_M_use_count = (local_240._M_pi)->_M_use_count + 1;
    }
  }
  iVar8 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar1 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a6da8;
  (this->super_PostStep).m_name = "DoubletonEquation";
  (this->super_PostStep).nCols = iVar1;
  (this->super_PostStep).nRows = iVar8;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_240);
  if (local_240._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DoubletonEquationPS_006a74c0;
  this->m_j = _j;
  this->m_k = _k;
  this->m_i = _i;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _j;
  pnVar11 = &local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = pnVar3[_j].m_backend.exp;
  local_b0.m_backend.neg = pnVar3[_j].m_backend.neg;
  local_b0.m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  local_b0.m_backend.prec_elem = pnVar3[_j].m_backend.prec_elem;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _j;
  pnVar11 = &local_130;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = pnVar3[_j].m_backend.exp;
  local_130.m_backend.neg = pnVar3[_j].m_backend.neg;
  local_130.m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  local_130.m_backend.prec_elem = pnVar3[_j].m_backend.prec_elem;
  a = Tolerances::epsilon((this->super_PostStep)._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_1b8.m_backend.fpclass = cpp_dec_float_finite;
  local_1b8.m_backend.prec_elem = 0x1c;
  local_1b8.m_backend.data._M_elems[0] = 0;
  local_1b8.m_backend.data._M_elems[1] = 0;
  local_1b8.m_backend.data._M_elems[2] = 0;
  local_1b8.m_backend.data._M_elems[3] = 0;
  local_1b8.m_backend.data._M_elems[4] = 0;
  local_1b8.m_backend.data._M_elems[5] = 0;
  local_1b8.m_backend.data._M_elems[6] = 0;
  local_1b8.m_backend.data._M_elems[7] = 0;
  local_1b8.m_backend.data._M_elems[8] = 0;
  local_1b8.m_backend.data._M_elems[9] = 0;
  local_1b8.m_backend.data._M_elems[10] = 0;
  local_1b8.m_backend.data._M_elems[0xb] = 0;
  local_1b8.m_backend.data._M_elems[0xc] = 0;
  local_1b8.m_backend.data._M_elems[0xd] = 0;
  local_1b8.m_backend.data._M_elems[0xe] = 0;
  local_1b8.m_backend.data._M_elems[0xf] = 0;
  local_1b8.m_backend.data._M_elems[0x10] = 0;
  local_1b8.m_backend.data._M_elems[0x11] = 0;
  local_1b8.m_backend.data._M_elems[0x12] = 0;
  local_1b8.m_backend.data._M_elems[0x13] = 0;
  local_1b8.m_backend.data._M_elems[0x14] = 0;
  local_1b8.m_backend.data._M_elems[0x15] = 0;
  local_1b8.m_backend.data._M_elems[0x16] = 0;
  local_1b8.m_backend.data._M_elems[0x17] = 0;
  local_1b8.m_backend.data._M_elems[0x18] = 0;
  local_1b8.m_backend.data._M_elems[0x19] = 0;
  local_1b8.m_backend.data._M_elems._104_5_ = 0;
  local_1b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.m_backend.exp = 0;
  local_1b8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_1b8,a);
  bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b0,&local_130,&local_1b8);
  this->m_jFixed = bVar7;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_jObj,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&local_238,lp,_j);
    pnVar11 = &local_238;
    pnVar13 = &this->m_jObj;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + (ulong)bVar14 * -8 + 4);
    }
    (this->m_jObj).m_backend.exp = local_238.m_backend.exp;
    (this->m_jObj).m_backend.neg = local_238.m_backend.neg;
    (this->m_jObj).m_backend.fpclass = local_238.m_backend.fpclass;
    (this->m_jObj).m_backend.prec_elem = local_238.m_backend.prec_elem;
    if (local_238.m_backend.fpclass != cpp_dec_float_finite ||
        (this->m_jObj).m_backend.data._M_elems[0] != 0) {
      (this->m_jObj).m_backend.neg = (bool)(local_238.m_backend.neg ^ 1);
    }
  }
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_kObj,lp,_k);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&local_238,lp,_k);
    pnVar11 = &local_238;
    pnVar13 = &this->m_kObj;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + (ulong)bVar14 * -8 + 4);
    }
    (this->m_kObj).m_backend.exp = local_238.m_backend.exp;
    (this->m_kObj).m_backend.neg = local_238.m_backend.neg;
    (this->m_kObj).m_backend.fpclass = local_238.m_backend.fpclass;
    (this->m_kObj).m_backend.prec_elem = local_238.m_backend.prec_elem;
    if (local_238.m_backend.fpclass != cpp_dec_float_finite ||
        (this->m_kObj).m_backend.data._M_elems[0] != 0) {
      (this->m_kObj).m_backend.neg = (bool)(local_238.m_backend.neg ^ 1);
    }
  }
  pNVar4 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem
           [(lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[_j].idx].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  pNVar10 = pNVar4;
  pnVar11 = &this->m_aij;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pNVar10->val).m_backend.data._M_elems[0];
    pNVar10 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar10 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_aij).m_backend.exp = (pNVar4->val).m_backend.exp;
  (this->m_aij).m_backend.neg = (pNVar4->val).m_backend.neg;
  iVar6 = (pNVar4->val).m_backend.prec_elem;
  (this->m_aij).m_backend.fpclass = (pNVar4->val).m_backend.fpclass;
  (this->m_aij).m_backend.prec_elem = iVar6;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = false;
  if ((pnVar3[_k].m_backend.fpclass != cpp_dec_float_NaN) &&
     (bVar7 = false, (oldLo->m_backend).fpclass != cpp_dec_float_NaN)) {
    iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&pnVar3[_k].m_backend,&oldLo->m_backend);
    bVar7 = 0 < iVar8;
  }
  this->m_strictLo = bVar7;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = false;
  if ((pnVar3[_k].m_backend.fpclass != cpp_dec_float_NaN) &&
     (bVar7 = false, (oldUp->m_backend).fpclass != cpp_dec_float_NaN)) {
    iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&pnVar3[_k].m_backend,&oldUp->m_backend);
    bVar7 = SUB41((uint)iVar8 >> 0x1f,0);
  }
  this->m_strictUp = bVar7;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _k;
  pnVar11 = &this->m_newLo;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_newLo).m_backend.exp = pnVar3[_k].m_backend.exp;
  (this->m_newLo).m_backend.neg = pnVar3[_k].m_backend.neg;
  iVar6 = pnVar3[_k].m_backend.prec_elem;
  (this->m_newLo).m_backend.fpclass = pnVar3[_k].m_backend.fpclass;
  (this->m_newLo).m_backend.prec_elem = iVar6;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _k;
  pnVar11 = &this->m_newUp;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_newUp).m_backend.exp = pnVar3[_k].m_backend.exp;
  (this->m_newUp).m_backend.neg = pnVar3[_k].m_backend.neg;
  iVar6 = pnVar3[_k].m_backend.prec_elem;
  (this->m_newUp).m_backend.fpclass = pnVar3[_k].m_backend.fpclass;
  (this->m_newUp).m_backend.prec_elem = iVar6;
  pnVar11 = oldLo;
  pnVar13 = &this->m_oldLo;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_oldLo).m_backend.exp = (oldLo->m_backend).exp;
  (this->m_oldLo).m_backend.neg = (oldLo->m_backend).neg;
  iVar6 = (oldLo->m_backend).prec_elem;
  (this->m_oldLo).m_backend.fpclass = (oldLo->m_backend).fpclass;
  (this->m_oldLo).m_backend.prec_elem = iVar6;
  pnVar11 = oldUp;
  pnVar13 = &this->m_oldUp;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_oldUp).m_backend.exp = (oldUp->m_backend).exp;
  (this->m_oldUp).m_backend.neg = (oldUp->m_backend).neg;
  iVar6 = (oldUp->m_backend).prec_elem;
  (this->m_oldUp).m_backend.fpclass = (oldUp->m_backend).fpclass;
  (this->m_oldUp).m_backend.prec_elem = iVar6;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _j;
  pnVar11 = &this->m_Lo_j;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_Lo_j).m_backend.exp = pnVar3[_j].m_backend.exp;
  (this->m_Lo_j).m_backend.neg = pnVar3[_j].m_backend.neg;
  iVar6 = pnVar3[_j].m_backend.prec_elem;
  (this->m_Lo_j).m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  (this->m_Lo_j).m_backend.prec_elem = iVar6;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _j;
  pnVar11 = &this->m_Up_j;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_Up_j).m_backend.exp = pnVar3[_j].m_backend.exp;
  (this->m_Up_j).m_backend.neg = pnVar3[_j].m_backend.neg;
  iVar6 = pnVar3[_j].m_backend.prec_elem;
  (this->m_Up_j).m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  (this->m_Up_j).m_backend.prec_elem = iVar6;
  pnVar3 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _i;
  pnVar11 = &this->m_lhs;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_lhs).m_backend.exp = pnVar3[_i].m_backend.exp;
  (this->m_lhs).m_backend.neg = pnVar3[_i].m_backend.neg;
  iVar6 = pnVar3[_i].m_backend.prec_elem;
  (this->m_lhs).m_backend.fpclass = pnVar3[_i].m_backend.fpclass;
  (this->m_lhs).m_backend.prec_elem = iVar6;
  pnVar3 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar3 + _i;
  pnVar11 = &this->m_rhs;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_rhs).m_backend.exp = pnVar3[_i].m_backend.exp;
  (this->m_rhs).m_backend.neg = pnVar3[_i].m_backend.neg;
  iVar6 = pnVar3[_i].m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = pnVar3[_i].m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar6;
  pIVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar8 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_k].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar5[iVar8].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar5 + iVar8));
  return;
}

Assistant:

DoubletonEquationPS(const SPxLPBase<R>& lp, int _j, int _k, int _i, R oldLo, R oldUp,
                          std::shared_ptr<Tolerances> tols)
         : PostStep("DoubletonEquation", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_k(_k)
         , m_i(_i)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_jFixed(EQ(lp.lower(_j), lp.upper(_j), this->epsilon()))
         , m_jObj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_kObj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_k) : -lp.obj(_k))
         , m_aij(lp.colVector(_j).value(0))
         , m_strictLo(lp.lower(_k) > oldLo)
         , m_strictUp(lp.upper(_k) < oldUp)
         , m_newLo(lp.lower(_k))
         , m_newUp(lp.upper(_k))
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_Lo_j(lp.lower(_j))
         , m_Up_j(lp.upper(_j))
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_col(lp.colVector(_k))
      {}